

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O0

int __thiscall soplex::IdxSet::dim(IdxSet *this)

{
  int iVar1;
  IdxSet *in_RDI;
  int i;
  int ddim;
  int local_10;
  int local_c;
  
  local_c = -1;
  local_10 = 0;
  while( true ) {
    iVar1 = size(in_RDI);
    if (iVar1 <= local_10) break;
    if (local_c < in_RDI->idx[local_10]) {
      local_c = in_RDI->idx[local_10];
    }
    local_10 = local_10 + 1;
  }
  return local_c;
}

Assistant:

int IdxSet::dim() const
{
   int ddim = -1;

   for(int i = 0; i < size(); i++)
      if(ddim < idx[i])
         ddim = idx[i];

   return ddim;
}